

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

bool __thiscall
Fossilize::FeatureFilter::Impl::attachment_description_is_supported
          (Impl *this,VkAttachmentDescription *desc,VkFormatFeatureFlags format_features)

{
  bool bVar1;
  VkFormatFeatureFlags format_features_local;
  VkAttachmentDescription *desc_local;
  Impl *this_local;
  
  bVar1 = image_layout_is_supported(this,desc->initialLayout);
  if (bVar1) {
    bVar1 = image_layout_is_supported(this,desc->finalLayout);
    if (bVar1) {
      if ((format_features != 0) &&
         (bVar1 = format_is_supported(this,desc->format,format_features), !bVar1)) {
        return false;
      }
      bVar1 = load_op_is_supported(this,desc->loadOp);
      if (bVar1) {
        bVar1 = load_op_is_supported(this,desc->stencilLoadOp);
        if (bVar1) {
          bVar1 = store_op_is_supported(this,desc->storeOp);
          if (bVar1) {
            bVar1 = store_op_is_supported(this,desc->stencilStoreOp);
            if (bVar1) {
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FeatureFilter::Impl::attachment_description_is_supported(const VkAttachmentDescription &desc,
                                                              VkFormatFeatureFlags format_features) const
{
	if (!image_layout_is_supported(desc.initialLayout))
		return false;
	if (!image_layout_is_supported(desc.finalLayout))
		return false;
	if (format_features && !format_is_supported(desc.format, format_features))
		return false;
	if (!load_op_is_supported(desc.loadOp))
		return false;
	if (!load_op_is_supported(desc.stencilLoadOp))
		return false;
	if (!store_op_is_supported(desc.storeOp))
		return false;
	if (!store_op_is_supported(desc.stencilStoreOp))
		return false;

	return true;
}